

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

arena_t * arena_choose_huge(tsd_t *tsd)

{
  arena_t *arena;
  
  arena = (arena_t *)arenas[huge_arena_ind].repr;
  if (arena == (arena_t *)0x0) {
    arena = (arena_t *)arenas[huge_arena_ind].repr;
    if (arena == (arena_t *)0x0) {
      arena = arena_init((tsdn_t *)tsd,huge_arena_ind,&extent_hooks_default);
    }
    if (arena == (arena_t *)0x0) {
      arena = (arena_t *)0x0;
    }
    else {
      if (0 < dirty_decay_ms_default.repr) {
        arena_decay_ms_set((tsdn_t *)tsd,arena,&arena->decay_dirty,&arena->extents_dirty,0);
      }
      if (0 < muzzy_decay_ms_default.repr) {
        arena_decay_ms_set((tsdn_t *)tsd,arena,&arena->decay_muzzy,&arena->extents_muzzy,0);
      }
    }
  }
  return arena;
}

Assistant:

arena_t *
arena_choose_huge(tsd_t *tsd) {
	/* huge_arena_ind can be 0 during init (will use a0). */
	if (huge_arena_ind == 0) {
		assert(!malloc_initialized());
	}

	arena_t *huge_arena = arena_get(tsd_tsdn(tsd), huge_arena_ind, false);
	if (huge_arena == NULL) {
		/* Create the huge arena on demand. */
		assert(huge_arena_ind != 0);
		huge_arena = arena_get(tsd_tsdn(tsd), huge_arena_ind, true);
		if (huge_arena == NULL) {
			return NULL;
		}
		/*
		 * Purge eagerly for huge allocations, because: 1) number of
		 * huge allocations is usually small, which means ticker based
		 * decay is not reliable; and 2) less immediate reuse is
		 * expected for huge allocations.
		 */
		if (arena_dirty_decay_ms_default_get() > 0) {
			arena_dirty_decay_ms_set(tsd_tsdn(tsd), huge_arena, 0);
		}
		if (arena_muzzy_decay_ms_default_get() > 0) {
			arena_muzzy_decay_ms_set(tsd_tsdn(tsd), huge_arena, 0);
		}
	}

	return huge_arena;
}